

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

vector<Lesson,_std::allocator<Lesson>_> *
find_free_spot_for_lesson
          (vector<Lesson,_std::allocator<Lesson>_> *__return_storage_ptr__,Group *group,
          string *lesson_name,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Lesson,_std::allocator<Lesson>_>_>_>_>
          *possible_places,bool doubled)

{
  Lesson *pLVar1;
  _Base_ptr __n;
  bool bVar2;
  long lVar3;
  long lVar4;
  pointer pLVar5;
  bool bVar6;
  int iVar7;
  _Rb_tree_header *p_Var8;
  pointer piVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  Lesson *pLVar13;
  pointer pLVar14;
  bool bVar15;
  bool bVar16;
  int local_27c;
  vector<int,_std::allocator<int>_> busy_ids;
  Lesson lesson;
  vector<Lesson,_std::allocator<Lesson>_> all_lessons_with_this_name;
  string local_178;
  _Base_ptr local_158;
  Lesson *local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_148;
  Lesson *local_140;
  string local_138;
  string local_118;
  string local_f8;
  Lesson lesson_2;
  
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Lesson,_std::allocator<Lesson>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pLVar13 = (group->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
            super__Vector_impl_data._M_start;
  pLVar1 = (group->lesson_map).super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pLVar13 != pLVar1) {
    do {
      Lesson::Lesson(&lesson,pLVar13);
      iVar7 = std::__cxx11::string::compare((char *)&lesson.subject);
      if (iVar7 != 0) {
        lesson_2.lesson_id._0_4_ = (int)lesson.lesson_id;
        if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&busy_ids,
                     (iterator)
                     busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&lesson_2);
        }
        else {
          *busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = (int)lesson.lesson_id;
          busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.time._M_dataplus._M_p != &lesson.time.field_2) {
        operator_delete(lesson.time._M_dataplus._M_p,lesson.time.field_2._M_allocated_capacity + 1);
      }
      std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
        operator_delete(lesson.professor._M_dataplus._M_p,
                        lesson.professor.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
        operator_delete(lesson.room._M_dataplus._M_p,lesson.room.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
        operator_delete(lesson.subject._M_dataplus._M_p,
                        lesson.subject.field_2._M_allocated_capacity + 1);
      }
      pLVar13 = pLVar13 + 1;
    } while (pLVar13 != pLVar1);
  }
  p_Var10 = (possible_places->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var8 = &(possible_places->_M_t)._M_impl.super__Rb_tree_header;
  bVar15 = (_Rb_tree_header *)p_Var10 == p_Var8;
  if (bVar15) {
    bVar6 = false;
  }
  else {
    paVar12 = &lesson.time.field_2;
    local_148 = &lesson_2.time.field_2;
    bVar6 = false;
    do {
      __n = p_Var10[1]._M_parent;
      bVar16 = true;
      if ((__n == (_Base_ptr)lesson_name->_M_string_length) &&
         ((__n == (_Base_ptr)0x0 ||
          (iVar7 = bcmp(*(void **)(p_Var10 + 1),(lesson_name->_M_dataplus)._M_p,(size_t)__n),
          iVar7 == 0)))) {
        local_158 = p_Var10;
        std::vector<Lesson,_std::allocator<Lesson>_>::vector
                  (&all_lessons_with_this_name,
                   (vector<Lesson,_std::allocator<Lesson>_> *)(p_Var10 + 2));
        std::
        shuffle<__gnu_cxx::__normal_iterator<Lesson*,std::vector<Lesson,std::allocator<Lesson>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  ((__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                   all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>)
                   all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&rng);
        pLVar5 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        bVar16 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                 _M_impl.super__Vector_impl_data._M_start ==
                 all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pLVar1 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pLVar13 = local_150;
        if (doubled) {
          while (local_150 = pLVar1, local_150 != pLVar5) {
            Lesson::Lesson(&lesson,local_150);
            local_27c = 0;
            local_140 = all_lessons_with_this_name.
                        super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            bVar16 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                     _M_impl.super__Vector_impl_data._M_start ==
                     all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            pLVar14 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            while (!bVar16) {
              Lesson::Lesson(&lesson_2,pLVar14);
              lVar4 = CONCAT44(lesson_2.lesson_id._4_4_,(int)lesson_2.lesson_id);
              lVar3 = CONCAT44(lesson.lesson_id._4_4_,(int)lesson.lesson_id);
              bVar2 = true;
              if (((lVar4 - lVar3 == 1) &&
                  (lesson.professor._M_string_length == lesson_2.professor._M_string_length)) &&
                 ((lesson.professor._M_string_length == 0 ||
                  (iVar7 = bcmp(lesson.professor._M_dataplus._M_p,
                                lesson_2.professor._M_dataplus._M_p,
                                lesson.professor._M_string_length), iVar7 == 0)))) {
                if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start !=
                    busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish) {
                  bVar11 = true;
                  piVar9 = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  do {
                    if (lVar4 == *piVar9) {
                      bVar11 = false;
                    }
                    if (lVar3 == *piVar9) {
                      bVar11 = false;
                    }
                    piVar9 = piVar9 + 1;
                  } while (piVar9 != busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_finish);
                  bVar2 = true;
                  if (!bVar11) goto LAB_0010f111;
                }
                std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                          (__return_storage_ptr__,&lesson);
                std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                          (__return_storage_ptr__,&lesson_2);
                bVar6 = true;
                bVar2 = false;
              }
LAB_0010f111:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson_2.time._M_dataplus._M_p != local_148) {
                operator_delete(lesson_2.time._M_dataplus._M_p,
                                lesson_2.time.field_2._M_allocated_capacity + 1);
              }
              std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson_2.prep_list);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson_2.professor._M_dataplus._M_p != &lesson_2.professor.field_2) {
                operator_delete(lesson_2.professor._M_dataplus._M_p,
                                lesson_2.professor.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson_2.room._M_dataplus._M_p != &lesson_2.room.field_2) {
                operator_delete(lesson_2.room._M_dataplus._M_p,
                                lesson_2.room.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson_2.subject._M_dataplus._M_p != &lesson_2.subject.field_2) {
                operator_delete(lesson_2.subject._M_dataplus._M_p,
                                lesson_2.subject.field_2._M_allocated_capacity + 1);
              }
              if (!bVar2) {
                local_27c = 1;
                break;
              }
              pLVar14 = pLVar14 + 1;
              bVar16 = pLVar14 == local_140;
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.time._M_dataplus._M_p != paVar12) {
              operator_delete(lesson.time._M_dataplus._M_p,
                              lesson.time.field_2._M_allocated_capacity + 1);
            }
            std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
              operator_delete(lesson.professor._M_dataplus._M_p,
                              lesson.professor.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
              operator_delete(lesson.room._M_dataplus._M_p,
                              lesson.room.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
              operator_delete(lesson.subject._M_dataplus._M_p,
                              lesson.subject.field_2._M_allocated_capacity + 1);
            }
            if (!bVar16) goto LAB_0010f400;
            pLVar13 = local_150;
            pLVar1 = local_150 + 1;
          }
          local_27c = 10;
          local_150 = pLVar13;
LAB_0010f400:
          if (local_27c == 10) {
LAB_0010f3c0:
            local_27c = 0;
          }
        }
        else {
          pLVar14 = all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if (all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl
              .super__Vector_impl_data._M_start !=
              all_lessons_with_this_name.super__Vector_base<Lesson,_std::allocator<Lesson>_>._M_impl
              .super__Vector_impl_data._M_finish) {
            do {
              Lesson::Lesson(&lesson,pLVar14);
              bVar2 = true;
              if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                piVar9 = busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                do {
                  if (CONCAT44(lesson.lesson_id._4_4_,(int)lesson.lesson_id) == (long)*piVar9) {
                    bVar2 = false;
                  }
                  piVar9 = piVar9 + 1;
                } while (piVar9 != busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish);
              }
              if (bVar2) {
                bVar6 = true;
                std::vector<Lesson,_std::allocator<Lesson>_>::push_back
                          (__return_storage_ptr__,&lesson);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson.time._M_dataplus._M_p != paVar12) {
                operator_delete(lesson.time._M_dataplus._M_p,
                                lesson.time.field_2._M_allocated_capacity + 1);
              }
              std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
                operator_delete(lesson.professor._M_dataplus._M_p,
                                lesson.professor.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
                operator_delete(lesson.room._M_dataplus._M_p,
                                lesson.room.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
                operator_delete(lesson.subject._M_dataplus._M_p,
                                lesson.subject.field_2._M_allocated_capacity + 1);
              }
              if (bVar2) break;
              pLVar14 = pLVar14 + 1;
              bVar16 = pLVar14 == pLVar5;
            } while (!bVar16);
          }
          local_27c = 1;
          if (bVar16) goto LAB_0010f3c0;
        }
        std::vector<Lesson,_std::allocator<Lesson>_>::~vector(&all_lessons_with_this_name);
        bVar16 = local_27c == 0;
        p_Var10 = local_158;
      }
      if (!bVar16) break;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      bVar15 = (_Rb_tree_header *)p_Var10 == p_Var8;
    } while (!bVar15);
  }
  if (bVar15) {
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"");
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138);
    Lesson::Lesson(&lesson,0,false,false,false,&local_178,&local_f8,&local_118,&local_138);
    std::vector<Lesson,_std::allocator<Lesson>_>::emplace_back<Lesson>
              (__return_storage_ptr__,&lesson);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lesson.time._M_dataplus._M_p != &lesson.time.field_2) {
      operator_delete(lesson.time._M_dataplus._M_p,lesson.time.field_2._M_allocated_capacity + 1);
    }
    std::vector<Professor,_std::allocator<Professor>_>::~vector(&lesson.prep_list);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lesson.professor._M_dataplus._M_p != &lesson.professor.field_2) {
      operator_delete(lesson.professor._M_dataplus._M_p,
                      lesson.professor.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lesson.room._M_dataplus._M_p != &lesson.room.field_2) {
      operator_delete(lesson.room._M_dataplus._M_p,lesson.room.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)lesson.subject._M_dataplus._M_p != &lesson.subject.field_2) {
      operator_delete(lesson.subject._M_dataplus._M_p,
                      lesson.subject.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
    }
  }
  else if (!bVar6) {
    std::vector<Lesson,_std::allocator<Lesson>_>::~vector(__return_storage_ptr__);
  }
  if (busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)busy_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Lesson> find_free_spot_for_lesson(Group group, std::string lesson_name, std::map<std::string, std::vector<Lesson>> possible_places, bool doubled) {
    //BUSY IDS
    std::vector<int> busy_ids;
    std::vector<Lesson> new_lessons;
    for (auto lesson:group.lesson_map) {
        if (lesson.subject != "")
            busy_ids.push_back(lesson.lesson_id);
    }

    for(const auto & it: possible_places) {
        if(it.first == lesson_name) {
            std::vector<Lesson> all_lessons_with_this_name = it.second;
            std::shuffle(std::begin(all_lessons_with_this_name), std::end(all_lessons_with_this_name), rng); //shuffle lessons
            if(doubled == false) {
                for (auto lesson:all_lessons_with_this_name) {
                    bool flag = true;
                    for (auto id: busy_ids) {
                       if (lesson.lesson_id == id)
                           flag = false;
                   }
                   if (flag == true) {
                       new_lessons.push_back(lesson);
                        //std::cout<<lesson_name << std::endl;
                        //lesson.print();
                        //std::cout<<lesson.lesson_id<<std::endl;
                        return new_lessons;
                   }

                }
            }
            else {
                for(auto lesson_1: all_lessons_with_this_name) {
                    for(auto lesson_2: all_lessons_with_this_name) {
                        bool flag = true;
                        if (((lesson_2.lesson_id - lesson_1.lesson_id) == 1) && (lesson_1.professor == lesson_2.professor)) {

                            for(auto id: busy_ids) {
                                if ((lesson_1.lesson_id == id) || (lesson_2.lesson_id == id))
                                    flag = false;
                            }
                            if (flag == true) {
                                new_lessons.push_back(lesson_1);
                                new_lessons.push_back(lesson_2);
                                return new_lessons;
                            }
                        }


                    }
                }
            }
        }
    }
    new_lessons.push_back(Lesson());
    return new_lessons;
}